

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O1

psa_status_t psa_import_key_into_slot(psa_key_slot_t *slot,uint8_t *data,size_t data_length)

{
  mbedtls_mpi *X;
  psa_key_type_t type;
  bool bVar1;
  mbedtls_ecp_keypair *pmVar2;
  psa_key_bits_t pVar3;
  psa_status_t pVar4;
  psa_status_t pVar5;
  int iVar6;
  mbedtls_pk_type_t mVar7;
  void *pvVar8;
  size_t sVar9;
  ushort uVar10;
  mbedtls_mpi n;
  mbedtls_pk_context mStack_58;
  mbedtls_ecp_keypair *local_48 [3];
  
  type = (slot->attr).type;
  uVar10 = type & 0x7000;
  if ((uVar10 == 0x2000) || (uVar10 == 0x1000)) {
    if (data_length * 8 < 0xfff9 && data_length >> 0x3d == 0) {
      pVar4 = prepare_raw_data_slot(type,data_length * 8,&(slot->data).raw);
      if (pVar4 == 0) {
        bVar1 = true;
        pVar5 = 0;
        if (data_length != 0) {
          pvVar8 = memcpy((slot->data).raw.data,data,data_length);
          pVar4 = (psa_status_t)pvVar8;
          pVar5 = 0;
        }
      }
      else {
        bVar1 = false;
        pVar5 = pVar4;
      }
    }
    else {
      pVar4 = -0x86;
      bVar1 = false;
      pVar5 = 0;
    }
    if (!bVar1) {
      return pVar4;
    }
  }
  else if ((type & 0xff00) == 0x4100) {
    pVar5 = psa_import_ec_public_key((psa_ecc_curve_t)type,data,data_length,&(slot->data).ecp);
  }
  else if ((type & 0xff00) == 0x7100) {
    local_48[0] = (mbedtls_ecp_keypair *)0x0;
    pVar5 = psa_prepare_import_ec_key((psa_ecc_curve_t)type,data_length,0,local_48);
    pmVar2 = local_48[0];
    if (pVar5 == 0) {
      X = &local_48[0]->d;
      iVar6 = mbedtls_mpi_read_binary(X,data,data_length);
      pVar5 = mbedtls_to_psa_error(iVar6);
      if (pVar5 == 0) {
        iVar6 = mbedtls_ecp_check_privkey(&pmVar2->grp,X);
        pVar5 = mbedtls_to_psa_error(iVar6);
        if (pVar5 == 0) {
          iVar6 = mbedtls_ecp_mul(&pmVar2->grp,&pmVar2->Q,X,&(pmVar2->grp).G,mbedtls_ctr_drbg_random
                                  ,&global_data.ctr_drbg);
          pVar5 = mbedtls_to_psa_error(iVar6);
          if (pVar5 == 0) {
            (slot->data).ecp = pmVar2;
            goto LAB_00111ee7;
          }
        }
      }
    }
    pmVar2 = local_48[0];
    if (local_48[0] != (mbedtls_ecp_keypair *)0x0) {
      mbedtls_ecp_keypair_free(local_48[0]);
      free(pmVar2);
    }
  }
  else {
    if ((type & 0xcfff) != 0x4001) {
      return -0x86;
    }
    mbedtls_pk_init(&mStack_58);
    if (uVar10 == 0x7000) {
      iVar6 = mbedtls_pk_parse_key(&mStack_58,data,data_length,(uchar *)0x0,0);
    }
    else {
      iVar6 = mbedtls_pk_parse_public_key(&mStack_58,data,data_length);
    }
    pVar5 = mbedtls_to_psa_error(iVar6);
    if (pVar5 == 0) {
      mVar7 = mbedtls_pk_get_type(&mStack_58);
      if (mVar7 == MBEDTLS_PK_RSA) {
        sVar9 = mbedtls_rsa_get_len((mbedtls_rsa_context *)mStack_58.pk_ctx);
        pVar5 = -0x86;
        data_length = (size_t)mStack_58.pk_ctx;
        if (sVar9 * 8 < 0x1001) {
          mbedtls_mpi_init((mbedtls_mpi *)local_48);
          iVar6 = mbedtls_rsa_export((mbedtls_rsa_context *)mStack_58.pk_ctx,(mbedtls_mpi *)local_48
                                     ,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,
                                     (mbedtls_mpi *)0x0);
          pVar5 = mbedtls_to_psa_error(iVar6);
          if (pVar5 == 0) {
            sVar9 = mbedtls_mpi_bitlen((mbedtls_mpi *)local_48);
            pVar5 = -0x86;
            if ((sVar9 & 7) == 0) {
              pVar5 = 0;
            }
          }
          mbedtls_mpi_free((mbedtls_mpi *)local_48);
        }
      }
      else {
        pVar5 = -0x87;
      }
    }
    if (pVar5 == 0) {
      (slot->data).rsa = (mbedtls_rsa_context *)data_length;
LAB_00111ee7:
      pVar5 = 0;
    }
    else {
      mbedtls_pk_free(&mStack_58);
    }
  }
  if (pVar5 != 0) {
    return pVar5;
  }
  uVar10 = (slot->attr).type;
  if (((uVar10 & 0x7000) == 0x2000) || ((uVar10 & 0x7000) == 0x1000)) {
    sVar9 = (slot->data).raw.bytes;
  }
  else {
    if ((uVar10 & 0xcfff) != 0x4001) {
      if ((uVar10 & 0xcf00) == 0x4100) {
        pVar3 = (psa_key_bits_t)(((slot->data).rsa)->DQ).p;
      }
      else {
        pVar3 = 0;
      }
      goto LAB_00111f10;
    }
    sVar9 = mbedtls_rsa_get_len((slot->data).rsa);
  }
  pVar3 = (psa_key_bits_t)(sVar9 << 3);
LAB_00111f10:
  (slot->attr).bits = pVar3;
  return 0;
}

Assistant:

psa_status_t psa_import_key_into_slot( psa_key_slot_t *slot,
                                       const uint8_t *data,
                                       size_t data_length )
{
    psa_status_t status = PSA_SUCCESS;

    if( key_type_is_raw_bytes( slot->attr.type ) )
    {
        size_t bit_size = PSA_BYTES_TO_BITS( data_length );
        /* Ensure that the bytes-to-bit conversion didn't overflow. */
        if( data_length > SIZE_MAX / 8 )
            return( PSA_ERROR_NOT_SUPPORTED );
        /* Enforce a size limit, and in particular ensure that the bit
         * size fits in its representation type. */
        if( bit_size > PSA_MAX_KEY_BITS )
            return( PSA_ERROR_NOT_SUPPORTED );
        status = prepare_raw_data_slot( slot->attr.type, bit_size,
                                        &slot->data.raw );
        if( status != PSA_SUCCESS )
            return( status );
        if( data_length != 0 )
            memcpy( slot->data.raw.data, data, data_length );
    }
    else
#if defined(MBEDTLS_ECP_C)
    if( PSA_KEY_TYPE_IS_ECC_KEY_PAIR( slot->attr.type ) )
    {
        status = psa_import_ec_private_key( PSA_KEY_TYPE_GET_CURVE( slot->attr.type ),
                                            data, data_length,
                                            &slot->data.ecp );
    }
    else if( PSA_KEY_TYPE_IS_ECC_PUBLIC_KEY( slot->attr.type ) )
    {
        status = psa_import_ec_public_key(
            PSA_KEY_TYPE_GET_CURVE( slot->attr.type ),
            data, data_length,
            &slot->data.ecp );
    }
    else
#endif /* MBEDTLS_ECP_C */
#if defined(MBEDTLS_RSA_C) && defined(MBEDTLS_PK_PARSE_C)
    if( PSA_KEY_TYPE_IS_RSA( slot->attr.type ) )
    {
        status = psa_import_rsa_key( slot->attr.type,
            data, data_length,
            &slot->data.rsa );
    }
    else
#endif /* defined(MBEDTLS_RSA_C) && defined(MBEDTLS_PK_PARSE_C) */
    {
        return( PSA_ERROR_NOT_SUPPORTED );
    }

    if( status == PSA_SUCCESS )
    {
        /* Write the actual key size to the slot.
         * psa_start_key_creation() wrote the size declared by the
         * caller, which may be 0 (meaning unspecified) or wrong. */
        slot->attr.bits = psa_calculate_key_bits( slot );
    }
    return( status );
}